

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O3

void Assimp::Write(JSONWriter *out,aiNodeAnim *ai,bool is_elem)

{
  undefined1 *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  aiVectorKey *paVar2;
  aiQuatKey *paVar3;
  char cVar4;
  ostream *poVar5;
  stringstream *psVar6;
  long lVar7;
  ulong uVar8;
  string local_58;
  ostream *local_38;
  
  JSONWriter::StartObj(out,is_elem);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"name","");
  JSONWriter::Key(out,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  psVar6 = JSONWriter::LiteralToString(out,&out->buff,&ai->mNodeName);
  local_58._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(psVar6 + 0x10),(char *)&local_58,1)
  ;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"prestate","");
  JSONWriter::Key(out,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  this = &out->field_0x58;
  std::ostream::operator<<(this,ai->mPreState);
  local_58._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)&local_58,1);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"poststate","");
  JSONWriter::Key(out,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  std::ostream::operator<<(this,ai->mPostState);
  local_58._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)&local_58,1);
  cVar4 = (char)out;
  local_38 = (ostream *)this;
  if (ai->mNumPositionKeys != 0) {
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"positionkeys","");
    JSONWriter::Key(out,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    out->first = true;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"[\n",2);
    std::__cxx11::string::push_back(cVar4 + '\b');
    if (ai->mNumPositionKeys != 0) {
      lVar7 = 8;
      uVar8 = 0;
      do {
        paVar2 = ai->mPositionKeys;
        JSONWriter::StartArray(out,true);
        JSONWriter::Element<double>(out,(double *)((long)paVar2 + lVar7 + -8));
        Write(out,(aiVector3D *)((long)&paVar2->mTime + lVar7),true);
        JSONWriter::EndArray(out);
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x18;
      } while (uVar8 < ai->mNumPositionKeys);
    }
    JSONWriter::EndArray(out);
  }
  poVar5 = local_38;
  if (ai->mNumRotationKeys != 0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"rotationkeys","");
    JSONWriter::Key(out,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    out->first = true;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"[\n",2);
    std::__cxx11::string::push_back(cVar4 + '\b');
    if (ai->mNumRotationKeys != 0) {
      lVar7 = 8;
      uVar8 = 0;
      do {
        paVar3 = ai->mRotationKeys;
        JSONWriter::StartArray(out,true);
        JSONWriter::Element<double>(out,(double *)((long)paVar3 + lVar7 + -8));
        Write(out,(aiQuaternion *)((long)&paVar3->mTime + lVar7),true);
        JSONWriter::EndArray(out);
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x18;
      } while (uVar8 < ai->mNumRotationKeys);
    }
    JSONWriter::EndArray(out);
  }
  poVar5 = local_38;
  if (ai->mNumScalingKeys != 0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"scalingkeys","");
    JSONWriter::Key(out,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    out->first = true;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"[\n",2);
    std::__cxx11::string::push_back(cVar4 + '\b');
    if (ai->mNumScalingKeys != 0) {
      lVar7 = 8;
      uVar8 = 0;
      do {
        paVar2 = ai->mScalingKeys;
        JSONWriter::StartArray(out,true);
        JSONWriter::Element<double>(out,(double *)((long)paVar2 + lVar7 + -8));
        Write(out,(aiVector3D *)((long)&paVar2->mTime + lVar7),true);
        JSONWriter::EndArray(out);
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x18;
      } while (uVar8 < ai->mNumScalingKeys);
    }
    JSONWriter::EndArray(out);
  }
  JSONWriter::EndObj(out);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiNodeAnim& ai, bool is_elem = true) {
    out.StartObj(is_elem);

    out.Key("name");
    out.SimpleValue(ai.mNodeName);

    out.Key("prestate");
    out.SimpleValue(ai.mPreState);

    out.Key("poststate");
    out.SimpleValue(ai.mPostState);

    if (ai.mNumPositionKeys) {
        out.Key("positionkeys");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumPositionKeys; ++n) {
            const aiVectorKey& pos = ai.mPositionKeys[n];
            out.StartArray(true);
            out.Element(pos.mTime);
            Write(out, pos.mValue);
            out.EndArray();
        }
        out.EndArray();
    }

    if (ai.mNumRotationKeys) {
        out.Key("rotationkeys");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumRotationKeys; ++n) {
            const aiQuatKey& rot = ai.mRotationKeys[n];
            out.StartArray(true);
            out.Element(rot.mTime);
            Write(out, rot.mValue);
            out.EndArray();
        }
        out.EndArray();
    }

    if (ai.mNumScalingKeys) {
        out.Key("scalingkeys");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumScalingKeys; ++n) {
            const aiVectorKey& scl = ai.mScalingKeys[n];
            out.StartArray(true);
            out.Element(scl.mTime);
            Write(out, scl.mValue);
            out.EndArray();
        }
        out.EndArray();
    }
    out.EndObj();
}